

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_Stare(void)

{
  Task *in_RDI;
  string sStack_748;
  string local_728;
  RequiredFlag local_708;
  Task focusPlayer;
  Task bark;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"stare",(allocator<char> *)&focusPlayer);
  Task::Task(in_RDI,&local_728,Compound);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_748,"focusPlayer",(allocator<char> *)&bark);
  Task::Task(&focusPlayer,&sStack_748,Simple);
  std::__cxx11::string::~string((string *)&sStack_748);
  focusPlayer.action = FocusPlayer;
  create_Bark(&bark,StaringAtPlayer);
  Task::addSubtask(in_RDI,&focusPlayer);
  Task::addSubtask(in_RDI,&bark);
  local_708.id = PlayerIdentified;
  local_708.flag = true;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            (&(in_RDI->postconditions).requiredFlags,&local_708);
  Task::~Task(&bark);
  Task::~Task(&focusPlayer);
  return in_RDI;
}

Assistant:

Task create_Stare()
	{
		Task stare {"stare", TaskType::Compound};

		Task focusPlayer {"focusPlayer"};
		focusPlayer.action = Action::FocusPlayer;

		auto bark = create_Bark(Bark::StaringAtPlayer);

		//auto playMontage = create_PlayMontage(Montage::Stare);

		stare.addSubtask(focusPlayer);
		stare.addSubtask(bark);
		//stare.addSubtask(playMontage);

		stare.postconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, true});

		return stare;
	}